

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

int fmt::v7::detail::
    get_dynamic_spec<fmt::v7::detail::width_checker,fmt::v7::basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>,fmt::v7::detail::error_handler>
              (void)

{
  char *message;
  int iStack0000000000000008;
  long arg;
  undefined4 in_stack_00000018;
  error_handler local_1;
  
  switch(in_stack_00000018) {
  case 1:
    _iStack0000000000000008 = (ulong)iStack0000000000000008;
    if (-1 < (long)_iStack0000000000000008) goto LAB_001183c7;
    break;
  case 2:
    _iStack0000000000000008 = _iStack0000000000000008 & 0xffffffff;
    goto LAB_001183be;
  case 3:
    if (-1 < (long)_iStack0000000000000008) goto LAB_001183be;
    break;
  case 4:
  case 6:
switchD_00118393_caseD_4:
LAB_001183be:
    if (_iStack0000000000000008 >> 0x1f == 0) {
LAB_001183c7:
      return (int)_iStack0000000000000008;
    }
    message = "number is too big";
    goto LAB_001183d9;
  case 5:
    if (-1 < arg) goto switchD_00118393_caseD_4;
    break;
  default:
    message = "width is not integer";
    goto LAB_001183d9;
  }
  message = "negative width";
LAB_001183d9:
  error_handler::on_error(&local_1,message);
}

Assistant:

FMT_CONSTEXPR int get_dynamic_spec(FormatArg arg, ErrorHandler eh) {
  unsigned long long value = visit_format_arg(Handler<ErrorHandler>(eh), arg);
  if (value > to_unsigned(max_value<int>())) eh.on_error("number is too big");
  return static_cast<int>(value);
}